

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,size_t length,size_t *tick,size_t tick_len,
          ostream *ofs,t_BuildProcessingQueueType *queue)

{
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  _Map_pointer ppcVar4;
  char *pcVar5;
  pointer pcVar6;
  _Elt_pointer pbVar7;
  pointer pcVar8;
  pointer pcVar9;
  cmCTest *pcVar10;
  pointer pcVar11;
  vector<char,_std::allocator<char>_> *this_01;
  int iVar12;
  size_type sVar13;
  ostream *poVar14;
  _Map_pointer ppbVar15;
  _Elt_pointer pbVar16;
  bool bVar17;
  char *pcVar18;
  _Map_pointer ppcVar19;
  char *pcVar20;
  _Elt_pointer __lhs;
  _Self local_338;
  ulong *local_318;
  char *line;
  ostream *local_308;
  char *local_300;
  pointer local_2f8;
  t_ErrorsAndWarningsVector *local_2f0;
  vector<char,_std::allocator<char>_> *local_2e8;
  size_t local_2e0;
  _Deque_iterator<char,_char_&,_char_*> local_2d8;
  _Deque_iterator<char,_char_&,_char_*> local_2b8;
  _Self local_298;
  cmCTestBuildErrorWarning errorwarning;
  _Self local_f8;
  const_iterator local_d8;
  const_iterator local_b8;
  const_iterator local_98;
  const_iterator local_78;
  iterator local_50;
  
  pcVar20 = data + length;
  local_318 = tick;
  local_308 = ofs;
  local_300 = data;
  local_2e0 = tick_len;
  for (; data < pcVar20; data = data + 1) {
    std::deque<char,_std::allocator<char>_>::push_back(queue,data);
  }
  this->BuildOutputLogSize = this->BuildOutputLogSize + length;
  local_2e8 = &this->CurrentProcessingLine;
  this_00 = &this->PreContext;
  local_2f0 = &this->ErrorsAndWarnings;
  local_2f8 = (pointer)length;
  do {
    this_01 = local_2e8;
    pcVar1 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pcVar2 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_first;
    pcVar3 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    ppcVar4 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
              ._M_start._M_node;
    pcVar5 = (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    pcVar18 = pcVar2;
    ppcVar19 = ppcVar4;
    pcVar20 = pcVar3;
    local_338._M_cur = pcVar1;
    local_338._M_first = pcVar2;
    local_338._M_last = pcVar3;
    local_338._M_node = ppcVar4;
    while ((local_338._M_cur != pcVar5 && (*local_338._M_cur != '\n'))) {
      local_338._M_cur = local_338._M_cur + 1;
      if (local_338._M_cur == pcVar20) {
        local_338._M_node = ppcVar19 + 1;
        pcVar18 = ppcVar19[1];
        pcVar20 = pcVar18 + 0x200;
        ppcVar19 = local_338._M_node;
        local_338._M_cur = pcVar18;
        local_338._M_first = pcVar18;
        local_338._M_last = pcVar20;
      }
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    if (local_338._M_cur == pcVar5) {
      bVar17 = true;
      while (*local_318 * local_2e0 < this->BuildOutputLogSize) {
        *local_318 = *local_318 + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorwarning);
        std::operator<<((ostream *)&errorwarning,this->LastTickChar);
        pcVar10 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar10,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x421,local_338._M_cur,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorwarning);
        bVar17 = false;
        if ((*local_318 != 0) && (*local_318 % 0x32 == 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorwarning);
          poVar14 = std::operator<<((ostream *)&errorwarning,"  Size: ");
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          poVar14 = std::operator<<(poVar14,"K");
          poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
          std::operator<<(poVar14,"    ");
          pcVar10 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar10,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x429,local_338._M_cur,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorwarning);
          bVar17 = false;
        }
      }
      if (!bVar17) {
        this->LastTickChar = '.';
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorwarning);
      pcVar11 = local_2f8;
      pcVar20 = local_300;
      local_338._M_cur = local_300;
      local_338._M_first = local_2f8;
      operator<<((ostream *)&errorwarning,(cmCTestLogWrite *)&local_338);
      pcVar10 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar10,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x432,local_338._M_cur,false);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorwarning);
      errorwarning._0_8_ = pcVar20;
      errorwarning.Text._M_dataplus._M_p = pcVar11;
      operator<<(local_308,(cmCTestLogWrite *)&errorwarning);
      return;
    }
    pcVar6 = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar6) {
      (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar6;
    }
    local_2d8._M_cur = local_338._M_cur;
    local_2d8._M_first = pcVar18;
    local_2d8._M_last = pcVar20;
    local_2d8._M_node = ppcVar19;
    local_2b8._M_cur = pcVar1;
    local_2b8._M_first = pcVar2;
    local_2b8._M_last = pcVar3;
    local_2b8._M_node = ppcVar4;
    cmAppend<char,std::_Deque_iterator<char,char&,char*>>(local_2e8,&local_2b8,&local_2d8);
    errorwarning._0_8_ = errorwarning._0_8_ & 0xffffffffffffff00;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_01,&errorwarning.Error);
    line = (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
    iVar12 = ProcessSingleLine(this,line);
    local_78._M_cur =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_cur;
    local_78._M_first =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_first;
    local_78._M_last =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_last;
    local_78._M_node =
         (queue->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
         _M_start._M_node;
    std::operator+((_Self *)&errorwarning,&local_338,1);
    local_98._M_node =
         (_Map_pointer)
         CONCAT71(errorwarning.Text.field_2._M_allocated_capacity._1_7_,
                  errorwarning.Text.field_2._M_local_buf[0]);
    local_98._M_cur = (_Elt_pointer)errorwarning._0_8_;
    local_98._M_first = errorwarning.Text._M_dataplus._M_p;
    local_98._M_last = (_Elt_pointer)errorwarning.Text._M_string_length;
    std::deque<char,_std::allocator<char>_>::erase((iterator *)&local_298,queue,&local_78,&local_98)
    ;
    errorwarning.Text._M_dataplus._M_p = (pointer)&errorwarning.Text.field_2;
    errorwarning.Text._M_string_length = 0;
    errorwarning.Text.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFile._M_dataplus._M_p = (pointer)&errorwarning.SourceFile.field_2;
    errorwarning.SourceFile._M_string_length = 0;
    errorwarning.SourceFile.field_2._M_local_buf[0] = '\0';
    errorwarning.SourceFileTail._M_dataplus._M_p = (pointer)&errorwarning.SourceFileTail.field_2;
    errorwarning.SourceFileTail._M_string_length = 0;
    errorwarning.SourceFileTail.field_2._M_local_buf[0] = '\0';
    errorwarning.PreContext._M_dataplus._M_p = (pointer)&errorwarning.PreContext.field_2;
    errorwarning.PreContext._M_string_length = 0;
    errorwarning.PreContext.field_2._M_local_buf[0] = '\0';
    errorwarning.PostContext._M_dataplus._M_p = (pointer)&errorwarning.PostContext.field_2;
    errorwarning.PostContext._M_string_length = 0;
    errorwarning.PostContext.field_2._M_local_buf[0] = '\0';
    if (iVar12 == 2) {
      this->LastTickChar = '!';
      errorwarning.Error = true;
      this->TotalErrors = this->TotalErrors + 1;
LAB_00159b8d:
      errorwarning.LogLine = (int)this->OutputLineCounter + 1;
      std::__cxx11::string::assign((char *)&errorwarning.Text);
      errorwarning.PreContext._M_string_length = 0;
      *errorwarning.PreContext._M_dataplus._M_p = '\0';
      errorwarning.PostContext._M_string_length = 0;
      *errorwarning.PostContext._M_dataplus._M_p = '\0';
      __lhs = (this->PreContext).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pbVar16 = (this->PreContext).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppbVar15 = (this->PreContext).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
      pbVar7 = (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      while (__lhs != pbVar7) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_298,__lhs,"\n");
        std::__cxx11::string::append((string *)&errorwarning.PreContext);
        std::__cxx11::string::~string((string *)&local_298);
        __lhs = __lhs + 1;
        if (__lhs == pbVar16) {
          __lhs = ppbVar15[1];
          ppbVar15 = ppbVar15 + 1;
          pbVar16 = __lhs + 0x10;
        }
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>(local_2f0,&errorwarning);
      (this->LastErrorOrWarning)._M_current =
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      this->PostContextCount = 0;
    }
    else {
      if (iVar12 == 1) {
        this->LastTickChar = '*';
        errorwarning._0_4_ = errorwarning._1_4_ << 8;
        this->TotalWarnings = this->TotalWarnings + 1;
        goto LAB_00159b8d;
      }
      pcVar8 = (this->ErrorsAndWarnings).
               super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((((this->ErrorsAndWarnings).
            super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ._M_impl.super__Vector_impl_data._M_start == pcVar8) ||
          (pcVar9 = (this->LastErrorOrWarning)._M_current, pcVar9 == pcVar8)) ||
         (this->MaxPostContext <= this->PostContextCount)) {
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&line
                  );
        sVar13 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(this_00);
        if (this->MaxPreContext < sVar13) {
          local_b8._M_cur =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_b8._M_first =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first;
          local_b8._M_last =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_b8._M_node =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
          local_f8._M_cur =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_f8._M_first =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_f8._M_last =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_f8._M_node =
               (this->PreContext).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
          std::operator-(&local_298,&local_f8,this->MaxPreContext);
          local_d8._M_cur = local_298._M_cur;
          local_d8._M_first = local_298._M_first;
          local_d8._M_last = local_298._M_last;
          local_d8._M_node = local_298._M_node;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&local_50,this_00,&local_b8,&local_d8);
        }
      }
      else {
        this->PostContextCount = this->PostContextCount + 1;
        std::__cxx11::string::append((char *)&pcVar9->PostContext);
        if (this->PostContextCount < this->MaxPostContext) {
          std::__cxx11::string::append
                    ((char *)&((this->LastErrorOrWarning)._M_current)->PostContext);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning(&errorwarning);
  } while( true );
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, size_t length,
                                        size_t& tick, size_t tick_len,
                                        std::ostream& ofs,
                                        t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for (ptr = data; ptr < data + length; ptr++) {
    queue->push_back(*ptr);
  }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while (true) {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for (it = queue->begin(); it != queue->end(); ++it) {
      if (*it == '\n') {
        break;
      }
    }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if (this->TotalWarnings >= this->MaxWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->TotalErrors >= this->MaxErrors) {
      this->ErrorQuotaReached = true;
    }

    // If the end of line was found
    if (it != queue->end()) {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      cmAppend(this->CurrentProcessingLine, queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = this->CurrentProcessingLine.data();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it + 1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch (lineType) {
        case b_WARNING_LINE:
          this->LastTickChar = '*';
          errorwarning.Error = false;
          found = true;
          this->TotalWarnings++;
          break;
        case b_ERROR_LINE:
          this->LastTickChar = '!';
          errorwarning.Error = true;
          found = true;
          this->TotalErrors++;
          break;
      }
      if (found) {
        // This is an error or warning, so generate report
        errorwarning.LogLine = static_cast<int>(this->OutputLineCounter + 1);
        errorwarning.Text = line;
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();

        // Copy pre-context to report
        for (std::string const& pc : this->PreContext) {
          errorwarning.PreContext += pc + "\n";
        }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end() - 1;
        this->PostContextCount = 0;
      } else {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if (!this->ErrorsAndWarnings.empty() &&
            this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
            this->PostContextCount < this->MaxPostContext) {
          this->PostContextCount++;
          this->LastErrorOrWarning->PostContext += line;
          if (this->PostContextCount < this->MaxPostContext) {
            this->LastErrorOrWarning->PostContext += "\n";
          }
        } else {
          // Otherwise store pre-context for the next error
          this->PreContext.emplace_back(line);
          if (this->PreContext.size() > this->MaxPreContext) {
            this->PreContext.erase(this->PreContext.begin(),
                                   this->PreContext.end() -
                                     this->MaxPreContext);
          }
        }
      }
      this->OutputLineCounter++;
    } else {
      break;
    }
  }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while (this->BuildOutputLogSize > (tick * tick_len)) {
    tick++;
    cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                       this->LastTickChar, this->Quiet);
    tickDisplayed = true;
    if (tick % tick_line_len == 0 && tick > 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                         "  Size: "
                           << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                           << std::endl
                           << "    ",
                         this->Quiet);
    }
  }
  if (tickDisplayed) {
    this->LastTickChar = '.';
  }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}